

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O2

void Map_MappingTruths(Map_Man_t *pMan)

{
  uint uVar1;
  Map_Node_t *p;
  int iVar2;
  ProgressBar *p_00;
  Map_Super_t *pMVar3;
  char *__assertion;
  ulong uVar4;
  ulong uVar5;
  Map_Cut_t *pCut;
  ulong local_50;
  uchar uPhases [16];
  uint uCanon [2];
  
  uVar1 = pMan->vMapObjs->nSize;
  p_00 = Extra_ProgressBarStart(_stdout,uVar1);
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar4 == uVar5) {
      Extra_ProgressBarStop(p_00);
      return;
    }
    p = pMan->vMapObjs->pArray[uVar4];
    iVar2 = Map_NodeIsAnd(p);
    if (iVar2 != 0) {
      pCut = p->pCuts;
      if (pCut == (Map_Cut_t *)0x0) {
        __assertion = "pNode->pCuts";
        uVar1 = 0x3d;
LAB_0036a275:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                      ,uVar1,"void Map_MappingTruths(Map_Man_t *)");
      }
      if (pCut->nLeaves != '\x01') {
        __assertion = "pNode->pCuts->nLeaves == 1";
        uVar1 = 0x3e;
        goto LAB_0036a275;
      }
      pCut->M[0].uPhase = 0;
      pMVar3 = pMan->pSuperLib->pSuperInv;
      pCut->M[0].pSupers = pMVar3;
      pCut->M[0].uPhaseBest = 0;
      pCut->M[0].pSuperBest = pMVar3;
      pCut->M[1].uPhase = 0;
      pCut->M[1].uPhaseBest = 1;
      pCut->M[1].pSupers = pMVar3;
      pCut->M[1].pSuperBest = pMVar3;
      while (pCut = pCut->pNext, pCut != (Map_Cut_t *)0x0) {
        if (pCut->nLeaves != '\x01') {
          Map_TruthsCutOne(pMan,pCut,(uint *)&local_50);
          Map_CanonComputeFast
                    (pMan,pMan->nVarsMax,(int)pCut->nLeaves,(uint *)&local_50,uPhases,uCanon);
          pMVar3 = Map_SuperTableLookupC(pMan->pSuperLib,uCanon);
          pCut->M[1].pSupers = pMVar3;
          pCut->M[1].uPhase = (uint)uPhases[0];
          pMan->nCanons = pMan->nCanons + 1;
          local_50 = ~local_50;
          Map_CanonComputeFast
                    (pMan,pMan->nVarsMax,(int)pCut->nLeaves,(uint *)&local_50,uPhases,uCanon);
          pMVar3 = Map_SuperTableLookupC(pMan->pSuperLib,uCanon);
          pCut->M[0].pSupers = pMVar3;
          pCut->M[0].uPhase = (uint)uPhases[0];
          pMan->nCanons = pMan->nCanons + 1;
        }
      }
      if ((p_00 == (ProgressBar *)0x0) || ((long)p_00->nItemsNext <= (long)uVar4)) {
        Extra_ProgressBarUpdate_int(p_00,(int)uVar4,"Tables ...");
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void Map_MappingTruths( Map_Man_t * pMan )
{
    ProgressBar * pProgress;
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    int nNodes, i;
    // compute the cuts for the POs
    nNodes = pMan->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( !Map_NodeIsAnd( pNode ) )
            continue;
        assert( pNode->pCuts );
        assert( pNode->pCuts->nLeaves == 1 );

        // match the simple cut
        pNode->pCuts->M[0].uPhase     = 0;
        pNode->pCuts->M[0].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[0].uPhaseBest = 0;
        pNode->pCuts->M[0].pSuperBest = pMan->pSuperLib->pSuperInv;

        pNode->pCuts->M[1].uPhase     = 0;
        pNode->pCuts->M[1].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[1].uPhaseBest = 1;
        pNode->pCuts->M[1].pSuperBest = pMan->pSuperLib->pSuperInv;

        // match the rest of the cuts
        for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
             Map_TruthsCut( pMan, pCut );
        Extra_ProgressBarUpdate( pProgress, i, "Tables ..." );
    }
    Extra_ProgressBarStop( pProgress );
}